

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStructType
          (BinaryReaderIR *this,Index index,Index field_count,TypeMut *fields)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 local_50 [48];
  
  GetLocation((Location *)(local_50 + 0x10),this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_50);
  std::make_unique<wabt::StructType>();
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::resize
            ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)(local_50._16_8_ + 0x50),
             (ulong)field_count);
  uVar2 = local_50._16_8_;
  for (lVar3 = 0; (ulong)field_count * 0xc - lVar3 != 0; lVar3 = lVar3 + 0xc) {
    *(undefined8 *)(*(long *)(local_50._16_8_ + 0x50) + 0x20 + lVar3 * 4) =
         *(undefined8 *)((long)&(fields->type).enum_ + lVar3);
    *(bool *)(*(long *)(local_50._16_8_ + 0x50) + 0x28 + lVar3 * 4) = (&fields->mutable_)[lVar3];
  }
  local_50._16_8_ = 0;
  plVar1 = *(long **)(local_50._0_8_ + 0x40);
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)(local_50._0_8_ + 0x40)
  )->offset = uVar2;
  local_50._8_8_ = local_50._0_8_;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    local_50._8_8_ = local_50._0_8_;
  }
  local_50._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)(local_50 + 8));
  if ((long *)local_50._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 8))();
  }
  local_50._8_8_ = (char *)0x0;
  if (local_50._16_8_ != 0) {
    (**(code **)(*(long *)local_50._16_8_ + 8))();
  }
  if ((long *)local_50._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStructType(Index index,
                                    Index field_count,
                                    TypeMut* fields) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto struct_type = std::make_unique<StructType>();
  struct_type->fields.resize(field_count);
  for (Index i = 0; i < field_count; ++i) {
    struct_type->fields[i].type = fields[i].type;
    struct_type->fields[i].mutable_ = fields[i].mutable_;
  }
  field->type = std::move(struct_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}